

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalLut.c
# Opt level: O0

int Gia_ManBalanceGate(Gia_Man_t *pNew,Gia_Obj_t *pObj,Vec_Int_t *vSuper,int *pLits,int nLits)

{
  uint uVar1;
  int Entry;
  int iVar2;
  int iVar3;
  Bal_Man_t *p_00;
  int kBest;
  int iBest;
  int Res;
  int iLit;
  int i;
  Bal_Man_t *p;
  int nLits_local;
  int *pLits_local;
  Vec_Int_t *vSuper_local;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *pNew_local;
  
  Vec_IntClear(vSuper);
  if (nLits == 1) {
    Vec_IntPush(vSuper,*pLits);
  }
  else if (nLits == 2) {
    Vec_IntPush(vSuper,*pLits);
    Vec_IntPush(vSuper,pLits[1]);
    Gia_ManCreateGate(pNew,pObj,vSuper);
  }
  else if (2 < nLits) {
    p_00 = Bal_GiaMan(pNew);
    for (Res = 0; Res < nLits; Res = Res + 1) {
      Vec_IntPush(vSuper,pLits[Res]);
    }
    Vec_IntSelectSortCostLit(vSuper,p_00->vCosts);
    while (iVar3 = Vec_IntSize(vSuper), 1 < iVar3) {
      uVar1 = Bal_ManFindBestPair(p_00,vSuper,pObj);
      iVar3 = Vec_IntEntry(vSuper,(int)uVar1 >> 0x10);
      Entry = Vec_IntEntry(vSuper,uVar1 & 0xffff);
      Vec_IntRemove(vSuper,iVar3);
      Vec_IntRemove(vSuper,Entry);
      iVar2 = Gia_ObjIsXor(pObj);
      if (iVar2 == 0) {
        iBest = Gia_ManHashAnd(pNew,iVar3,Entry);
      }
      else {
        iBest = Gia_ManHashXorReal(pNew,iVar3,Entry);
      }
      Bal_ManSetGateLevel(p_00,pObj,iBest);
      Vec_IntPushOrderCost(vSuper,p_00->vCosts,iBest);
    }
  }
  iVar3 = Vec_IntSize(vSuper);
  if (iVar3 != 1) {
    __assert_fail("Vec_IntSize(vSuper) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaBalLut.c"
                  ,0x35c,"int Gia_ManBalanceGate(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *, int *, int)"
                 );
  }
  iVar3 = Vec_IntEntry(vSuper,0);
  return iVar3;
}

Assistant:

static inline int Gia_ManBalanceGate( Gia_Man_t * pNew, Gia_Obj_t * pObj, Vec_Int_t * vSuper, int * pLits, int nLits )
{
    Vec_IntClear( vSuper );
    if ( nLits == 1 )
        Vec_IntPush( vSuper, pLits[0] );
    else if ( nLits == 2 )
    {
        Vec_IntPush( vSuper, pLits[0] );
        Vec_IntPush( vSuper, pLits[1] );
        Gia_ManCreateGate( pNew, pObj, vSuper );
    }
    else if ( nLits > 2 )
    {
        Bal_Man_t * p = Bal_GiaMan(pNew); int i;
        for ( i = 0; i < nLits; i++ )
            Vec_IntPush( vSuper, pLits[i] );
        // sort by level/cut-size
        Vec_IntSelectSortCostLit( vSuper, p->vCosts );
        // iterate till everything is grouped
        while ( Vec_IntSize(vSuper) > 1 )
        {
            int iLit, Res = Bal_ManFindBestPair( p, vSuper, pObj );
            int iBest = Vec_IntEntry( vSuper, Res >> 16 );
            int kBest = Vec_IntEntry( vSuper, Res & 0xFFFF );
            Vec_IntRemove( vSuper, iBest );
            Vec_IntRemove( vSuper, kBest );
            if ( Gia_ObjIsXor(pObj) )
                iLit = Gia_ManHashXorReal( pNew, iBest, kBest );
            else 
                iLit = Gia_ManHashAnd( pNew, iBest, kBest );
            Bal_ManSetGateLevel( p, pObj, iLit );
            Vec_IntPushOrderCost( vSuper, p->vCosts, iLit );
        }
    }
    // consider trivial case
    assert( Vec_IntSize(vSuper) == 1 );
    return Vec_IntEntry(vSuper, 0);
}